

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_usage_encoding_example.c
# Opt level: O2

int main(void)

{
  bech32_error error_code;
  size_t hrplen;
  bech32_bstring *bstring;
  char *__s;
  uchar dp [5];
  char hrp [6];
  
  builtin_strncpy(hrp,"hello",6);
  builtin_memcpy(dp,"\x0e\x0f\x03\x1f\r",5);
  hrplen = strlen(hrp);
  bstring = bech32_create_bstring(hrplen,5);
  if (bstring == (bech32_bstring *)0x0) {
    printf("bech32 string can not be created");
    error_code = E_BECH32_NO_MEMORY;
  }
  else {
    error_code = bech32_encode(bstring,hrp,dp,5);
    if (error_code == E_BECH32_SUCCESS) {
      puts(
          "bech32 encoding of human-readable part \'hello\' and data part \'[14, 15, 3, 31, 13]\' is:"
          );
      puts(bstring->string);
      bech32_free_bstring(bstring);
      error_code = E_BECH32_SUCCESS;
    }
    else {
      __s = bech32_strerror(error_code);
      puts(__s);
      bech32_free_bstring(bstring);
    }
  }
  return error_code;
}

Assistant:

int main(void) {
    // simple human readable part with some data
    char hrp[] = "hello";
    unsigned char dp[] = {14, 15, 3, 31, 13};

    // create storage for bech32 string
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));
    if(!bstring) {
        printf("bech32 string can not be created");
        return E_BECH32_NO_MEMORY;
    }

    // encode
    bech32_error err = bech32_encode(bstring, hrp, dp, sizeof(dp));
    if(err != E_BECH32_SUCCESS) {
        printf("%s\n", bech32_strerror(err));
        bech32_free_bstring(bstring);
        return (int)err;
    }

    printf("bech32 encoding of human-readable part \'hello\' and data part \'[14, 15, 3, 31, 13]\' is:\n");
    printf("%s\n", bstring->string);
    // prints "hello1w0rldjn365x"
    // ... "hello" + Bech32.separator ("1") + encoded data ("w0rld") + 6 char checksum ("jn365x")

    // free memory
    bech32_free_bstring(bstring);

    return E_BECH32_SUCCESS;
}